

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall V4L2Device::write_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  bool *pbVar4;
  int *piVar5;
  reference pvVar6;
  undefined4 *in_RSI;
  v4l2_buffer *in_RDI;
  bool bVar7;
  exception *exc;
  RawImagePtr image;
  bool ok;
  exception *exc_1;
  fstream result;
  bool save_jpeg_asis;
  string jpeg_file_name;
  __u32 idx;
  V4L2Device *in_stack_00000bb8;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffff9ec;
  DispatchAction in_stack_fffffffffffff9ee;
  Writer *in_stack_fffffffffffff9f0;
  bool *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  Level in_stack_fffffffffffffa0e;
  Writer *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  VerboseLevel in_stack_fffffffffffffa20;
  undefined6 in_stack_fffffffffffffa22;
  Writer local_508;
  byte local_3f9;
  Writer local_370;
  undefined1 local_300 [16];
  char local_2f0 [296];
  string *in_stack_fffffffffffffe38;
  RawImagePtr *in_stack_fffffffffffffe40;
  V4L2Device *in_stack_fffffffffffffe48;
  allocator local_e9;
  string local_e8 [39];
  byte local_c1;
  undefined4 local_c0;
  Writer local_b0;
  string local_40 [36];
  undefined4 local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_1c = *in_RSI;
  make_jpeg_file_name_abi_cxx11_(in_stack_00000bb8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff9f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"save-jpeg-asis",&local_e9);
    cxxopts::Options::operator[]
              ((Options *)CONCAT62(in_stack_fffffffffffffa22,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa18);
    pbVar4 = cxxopts::OptionDetails::as<bool>((OptionDetails *)in_stack_fffffffffffff9f0);
    bVar7 = *pbVar4;
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_c1 = bVar7 & 1;
    if (local_c1 == 0) {
      std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>::
      unique_ptr<std::default_delete<V4L2Device::RawImage>,void>
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9f0);
      decompress_jpeg((V4L2Device *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      in_RDI);
      std::tie<bool,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>>
                (in_stack_fffffffffffff9f8,
                 (unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9f0);
      std::
      tuple<bool&,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>&>
      ::operator=((tuple<bool_&,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_&>
                   *)in_stack_fffffffffffff9f0,
                  (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
                   *)CONCAT26(in_stack_fffffffffffff9ee,
                              CONCAT24(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)));
      std::
      tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
      ::~tuple((tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
                *)0x1ea084);
      if ((local_3f9 & 1) == 0) {
        uVar8 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e,in_stack_fffffffffffffa00,
                   (LineNumber)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
                   in_stack_fffffffffffff9ee,in_stack_fffffffffffffa20);
        el::base::Writer::construct
                  ((Writer *)&stack0xfffffffffffffb68,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffff9f0,
                   (char (*) [28])
                   CONCAT26(in_stack_fffffffffffff9ee,CONCAT24(in_stack_fffffffffffff9ec,uVar8)));
        el::base::Writer::~Writer(in_stack_fffffffffffff9f0);
        bVar1 = 0;
      }
      else {
        bVar7 = compress_jpeg(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                              in_stack_fffffffffffffe38);
        if (bVar7) {
          bVar1 = 1;
        }
        else {
          uVar8 = 0;
          el::base::Writer::Writer
                    (in_stack_fffffffffffffa10,CONCAT11(bVar7,(char)in_stack_fffffffffffffa0e),
                     in_stack_fffffffffffffa00,(LineNumber)in_stack_fffffffffffff9f8,
                     (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ee,
                     in_stack_fffffffffffffa20);
          el::base::Writer::construct(&local_508,1,el::base::consts::kDefaultLoggerId);
          el::base::Writer::operator<<
                    (in_stack_fffffffffffff9f0,
                     (char (*) [26])
                     CONCAT26(in_stack_fffffffffffff9ee,CONCAT24(in_stack_fffffffffffff9ec,uVar8)));
          el::base::Writer::~Writer(in_stack_fffffffffffff9f0);
          bVar1 = 0;
        }
      }
      local_c0 = 1;
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 in_stack_fffffffffffff9f0);
    }
    else {
      _Var2 = std::operator|(_S_bin,_S_out);
      _Var2 = std::operator|(_Var2,_S_trunc);
      std::fstream::fstream(local_300,local_40,_Var2);
      bVar1 = std::ios::fail();
      bVar7 = (bVar1 & 1) != 0;
      if (bVar7) {
        uVar8 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e,in_stack_fffffffffffffa00,
                   (LineNumber)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
                   in_stack_fffffffffffff9ee,in_stack_fffffffffffffa20);
        el::base::Writer::construct(&local_370,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffff9f0,
                   (char (*) [19])
                   CONCAT26(in_stack_fffffffffffff9ee,CONCAT24(in_stack_fffffffffffff9ec,uVar8)));
        piVar5 = __errno_location();
        strerror(*piVar5);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffff9f0,
                   (char **)CONCAT26(in_stack_fffffffffffff9ee,
                                     CONCAT24(in_stack_fffffffffffff9ec,uVar8)));
        el::base::Writer::~Writer(in_stack_fffffffffffff9f0);
      }
      else {
        pvVar6 = std::array<V4L2Device::IOBuffer,_32UL>::operator[]
                           ((array<V4L2Device::IOBuffer,_32UL> *)in_stack_fffffffffffff9f0,
                            CONCAT26(in_stack_fffffffffffff9ee,
                                     CONCAT24(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)))
        ;
        std::ostream::write(local_2f0,(long)pvVar6->start);
      }
      bVar1 = !bVar7;
      local_c0 = 1;
      std::fstream::~fstream(local_300);
    }
  }
  else {
    uVar8 = 0;
    el::base::Writer::Writer
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e,in_stack_fffffffffffffa00,
               (LineNumber)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9ee,in_stack_fffffffffffffa20);
    el::base::Writer::construct(&local_b0,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (in_stack_fffffffffffff9f0,
               (char (*) [33])
               CONCAT26(in_stack_fffffffffffff9ee,CONCAT24(in_stack_fffffffffffff9ec,uVar8)));
    el::base::Writer::~Writer(in_stack_fffffffffffff9f0);
    bVar1 = 0;
    local_c0 = 1;
  }
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
    write_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        auto idx = bufferinfo.index;

        auto jpeg_file_name = make_jpeg_file_name();
        if (jpeg_file_name.empty()) {
            LOG(ERROR) << "couldn't create result file name";
            return false;
        }

        auto save_jpeg_asis = (*options)["save-jpeg-asis"].as<bool>();
        if (save_jpeg_asis) { // store jpeg as we have received it from the camera
            std::fstream result(jpeg_file_name, std::ios::binary | std::ios::out | std::ios::trunc);
            if (result.fail()) {
                LOG(ERROR) << "open file failed: " << strerror(errno);
                return false;
            }

            try {
                result.write(static_cast<const char*>(buffers[idx].start), bufferinfo.length);
            } catch (std::exception& exc) {
                LOG(ERROR) << "write file failed: " << exc.what();
                return false;
            }

            return true;
        }

        // (Re)compress JPEG

        bool ok;
        RawImagePtr image;

        try {
            std::tie(ok, image) = decompress_jpeg(bufferinfo);
            if (not ok) {
                LOG(ERROR) << "image decompression failed!";
                return false;
            }

            ok = compress_jpeg(image, jpeg_file_name);
            if (not ok) {
                LOG(ERROR) << "image compression failed!";
                return false;
            }
        } catch (std::exception& exc) {
            LOG(WARNING) << "image (de)compression failed: " << exc.what();
            return false;
        }

        return true;
    }